

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_predictive_coefficients_to_line_spectral_pairs.cc
# Opt level: O3

bool __thiscall
sptk::LinearPredictiveCoefficientsToLineSpectralPairs::Run
          (LinearPredictiveCoefficientsToLineSpectralPairs *this,
          vector<double,_std::allocator<double>_> *linear_predictive_coefficients,
          vector<double,_std::allocator<double>_> *line_spectral_pairs,Buffer *buffer)

{
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  double *pdVar1;
  pointer pdVar2;
  double *pdVar3;
  double *c;
  long lVar4;
  double *pdVar5;
  uint uVar6;
  double *pdVar7;
  int iVar8;
  size_type sVar9;
  int iVar10;
  double *pdVar11;
  long lVar12;
  ulong uVar13;
  vector<double,_std::allocator<double>_> *pvVar14;
  bool bVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double __x;
  
  if (this->is_valid_ == true) {
    if (buffer == (Buffer *)0x0) {
      return false;
    }
    if (line_spectral_pairs == (vector<double,_std::allocator<double>_> *)0x0) {
      return false;
    }
    lVar4 = (long)(linear_predictive_coefficients->
                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(linear_predictive_coefficients->
                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
    sVar9 = lVar4 >> 3;
    if (sVar9 != (long)this->num_order_ + 1U) {
      return false;
    }
    if ((long)(line_spectral_pairs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(line_spectral_pairs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start != lVar4) {
      std::vector<double,_std::allocator<double>_>::resize(line_spectral_pairs,sVar9);
    }
    this_00 = &buffer->c1_;
    sVar9 = (long)this->num_symmetric_polynomial_order_ + 1;
    if ((long)(buffer->c1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(buffer->c1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 != sVar9) {
      std::vector<double,_std::allocator<double>_>::resize(this_00,sVar9);
    }
    this_01 = &buffer->c2_;
    sVar9 = (long)this->num_asymmetric_polynomial_order_ + 1;
    if ((long)(buffer->c2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(buffer->c2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 != sVar9) {
      std::vector<double,_std::allocator<double>_>::resize(this_01,sVar9);
    }
    pdVar1 = (linear_predictive_coefficients->super__Vector_base<double,_std::allocator<double>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pdVar2 = (line_spectral_pairs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    *pdVar2 = *pdVar1;
    uVar13 = (ulong)this->num_order_;
    if (uVar13 == 0) {
      return true;
    }
    pdVar5 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar8 = this->num_symmetric_polynomial_order_;
    pdVar5[iVar8] = 1.0;
    iVar10 = this->num_asymmetric_polynomial_order_;
    lVar4 = (long)iVar10;
    pdVar3[lVar4] = 1.0;
    pdVar11 = pdVar1 + 1;
    pdVar7 = pdVar1 + uVar13;
    if ((uVar13 & 1) == 0) {
      if (0 < iVar8) {
        uVar13 = (long)iVar8 + 1;
        do {
          pdVar5[uVar13 - 2] = (*pdVar11 + *pdVar7) - pdVar5[uVar13 - 1];
          pdVar3[uVar13 - 2] = (*pdVar11 - *pdVar7) + pdVar3[uVar13 - 1];
          pdVar11 = pdVar11 + 1;
          pdVar7 = pdVar7 + -1;
          uVar13 = uVar13 - 1;
        } while (1 < uVar13);
      }
    }
    else {
      if (0 < iVar10) {
        uVar13 = lVar4 + 1;
        lVar12 = 0;
        do {
          *(double *)((long)pdVar5 + lVar12 + lVar4 * 8) =
               *pdVar11 + *(double *)((long)pdVar7 + lVar12);
          dVar16 = *pdVar11 - *(double *)((long)pdVar7 + lVar12);
          if (lVar12 != 0) {
            dVar16 = dVar16 + *(double *)((long)pdVar3 + lVar12 + lVar4 * 8 + 8);
          }
          *(double *)((long)pdVar3 + lVar12 + lVar4 * 8 + -8) = dVar16;
          pdVar11 = pdVar11 + 1;
          uVar13 = uVar13 - 1;
          lVar12 = lVar12 + -8;
        } while (1 < uVar13);
        pdVar11 = (double *)((long)pdVar1 + (8 - lVar12));
        pdVar7 = (double *)((long)pdVar7 + lVar12);
      }
      *pdVar5 = *pdVar11 + *pdVar7;
    }
    *pdVar5 = *pdVar5 * 0.5;
    *pdVar3 = *pdVar3 * 0.5;
    dVar16 = 0.0;
    dVar18 = 0.0;
    uVar6 = (uint)((ulong)((long)(buffer->c1_).super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)pdVar5) >> 3);
    if (1 < (int)uVar6) {
      uVar13 = (ulong)(uVar6 & 0x7fffffff) + 1;
      dVar17 = 0.0;
      do {
        dVar18 = dVar16;
        dVar16 = ((dVar18 + dVar18) - dVar17) + pdVar5[uVar13 - 2];
        uVar13 = uVar13 - 1;
        dVar17 = dVar18;
      } while (2 < uVar13);
    }
    dVar17 = 1.0;
    dVar23 = 1.0 / (double)this->num_split_;
    __x = 1.0 - dVar23;
    iVar8 = 0;
    if (__x <= -1.0 - dVar23) {
      return false;
    }
    dVar19 = *pdVar5;
    dVar16 = (dVar16 - dVar18) + dVar19;
    pvVar14 = this_00;
    do {
      dVar18 = 0.0;
      dVar20 = 0.0;
      uVar6 = (uint)((ulong)((long)(pvVar14->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pdVar5) >> 3);
      if (1 < (int)uVar6) {
        uVar13 = (ulong)(uVar6 & 0x7fffffff) + 1;
        dVar21 = 0.0;
        do {
          dVar20 = dVar18;
          dVar18 = ((__x + __x) * dVar20 - dVar21) + pdVar5[uVar13 - 2];
          uVar13 = uVar13 - 1;
          dVar21 = dVar20;
        } while (2 < uVar13);
      }
      dVar18 = (dVar18 * __x - dVar20) + dVar19;
      if (dVar16 * dVar18 <= 0.0) {
        if (0 < this->num_iteration_) {
          iVar10 = 0;
          dVar20 = dVar17;
          do {
            dVar22 = (__x + dVar20) * 0.5;
            dVar17 = 0.0;
            dVar21 = 0.0;
            if (1 < (int)uVar6) {
              uVar13 = (ulong)(uVar6 & 0x7fffffff) + 1;
              dVar24 = 0.0;
              do {
                dVar21 = dVar17;
                dVar17 = ((dVar22 + dVar22) * dVar21 - dVar24) + pdVar5[uVar13 - 2];
                uVar13 = uVar13 - 1;
                dVar24 = dVar21;
              } while (2 < uVar13);
            }
            dVar21 = (dVar17 * dVar22 - dVar21) + dVar19;
            dVar17 = dVar22;
            if (dVar16 * dVar21 <= 0.0) {
              dVar17 = dVar20;
              dVar18 = dVar21;
              __x = dVar22;
            }
            uVar13 = -(ulong)(0.0 < dVar16 * dVar21);
            dVar16 = (double)(~uVar13 & (ulong)dVar16 | uVar13 & (ulong)dVar21);
          } while ((this->convergence_threshold_ < ABS(dVar21)) &&
                  (iVar10 = iVar10 + 1, dVar20 = dVar17, iVar10 < this->num_iteration_));
        }
        __x = (dVar17 * dVar18 - __x * dVar16) / (dVar18 - dVar16);
        dVar16 = acos(__x);
        lVar4 = (long)iVar8;
        iVar8 = iVar8 + 1;
        pdVar2[lVar4 + 1] = dVar16 / 6.283185307179586;
        if (this->num_order_ == iVar8) {
          return true;
        }
        bVar15 = pvVar14 == this_00;
        pvVar14 = this_00;
        if (bVar15) {
          pvVar14 = this_01;
        }
        pdVar5 = (pvVar14->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar6 = (uint)((ulong)((long)(pvVar14->super__Vector_base<double,_std::allocator<double>_>).
                                     _M_impl.super__Vector_impl_data._M_finish - (long)pdVar5) >> 3)
        ;
        if ((int)uVar6 < 2) {
          dVar16 = __x * 0.0;
        }
        else {
          uVar13 = (ulong)(uVar6 & 0x7fffffff) + 1;
          dVar18 = 0.0;
          dVar17 = 0.0;
          do {
            dVar16 = dVar18;
            dVar18 = ((__x + __x) * dVar16 - dVar17) + pdVar5[uVar13 - 2];
            uVar13 = uVar13 - 1;
            dVar17 = dVar16;
          } while (2 < uVar13);
          dVar16 = dVar18 * __x - dVar16;
        }
        dVar19 = *pdVar5;
        dVar18 = dVar16 + dVar19;
      }
      dVar17 = __x;
      dVar16 = dVar18;
      __x = dVar17 - dVar23;
    } while (-1.0 - dVar23 < __x);
  }
  return false;
}

Assistant:

bool LinearPredictiveCoefficientsToLineSpectralPairs::Run(
    const std::vector<double>& linear_predictive_coefficients,
    std::vector<double>* line_spectral_pairs,
    LinearPredictiveCoefficientsToLineSpectralPairs::Buffer* buffer) const {
  // Check inputs.
  if (!is_valid_ ||
      linear_predictive_coefficients.size() !=
          static_cast<std::size_t>(num_order_ + 1) ||
      NULL == line_spectral_pairs || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (line_spectral_pairs->size() != static_cast<std::size_t>(num_order_ + 1)) {
    line_spectral_pairs->resize(num_order_ + 1);
  }
  if (buffer->c1_.size() !=
      static_cast<std::size_t>(num_symmetric_polynomial_order_ + 1)) {
    buffer->c1_.resize(num_symmetric_polynomial_order_ + 1);
  }
  if (buffer->c2_.size() !=
      static_cast<std::size_t>(num_asymmetric_polynomial_order_ + 1)) {
    buffer->c2_.resize(num_asymmetric_polynomial_order_ + 1);
  }

  // Copy gain.
  (*line_spectral_pairs)[0] = linear_predictive_coefficients[0];
  if (0 == num_order_) return true;

  // Calculate symmetric and antisymmetric polynomials.
  double* c1(&buffer->c1_[0]);
  double* c2(&buffer->c2_[0]);
  {
    c1[num_symmetric_polynomial_order_] = 1.0;
    c2[num_asymmetric_polynomial_order_] = 1.0;
    const double* p1(&(linear_predictive_coefficients[0]) + 1);
    const double* p2(&(linear_predictive_coefficients[0]) + num_order_);
    if (num_order_ % 2 == 0) {
      for (int i(num_symmetric_polynomial_order_ - 1); 0 <= i;
           --i, ++p1, --p2) {
        c1[i] = *p1 + *p2 - c1[i + 1];
        c2[i] = *p1 - *p2 + c2[i + 1];
      }
    } else {
      for (int i(num_asymmetric_polynomial_order_ - 1); 0 <= i;
           --i, ++p1, --p2) {
        c1[i + 1] = *p1 + *p2;
        c2[i] = (i == num_asymmetric_polynomial_order_ - 1)
                    ? *p1 - *p2
                    : *p1 - *p2 + c2[i + 2];
      }
      c1[0] = *p1 + *p2;
    }
    c1[0] *= 0.5;
    c2[0] *= 0.5;
  }

  const std::vector<double>* c(&buffer->c1_);
  int order(0);
  double x_prev(1.0);
  double y_prev(CalculateChebyshevPolynomial(*c, x_prev));
  double* w(&((*line_spectral_pairs)[0]));

  // Search roots of polynomials.
  const double delta(1.0 / num_split_);
  const double x_max(1.0 - delta);
  const double x_min(-1.0 - delta);
  for (double x(x_max); x_min < x; x -= delta) {
    double y(CalculateChebyshevPolynomial(*c, x));

    if (y * y_prev <= 0.0) {
      double x_lower(x);
      double x_upper(x_prev);
      double y_lower(y);
      double y_upper(y_prev);

      for (int n(0); n < num_iteration_; ++n) {
        const double x_mid((x_lower + x_upper) * 0.5);
        const double y_mid(CalculateChebyshevPolynomial(*c, x_mid));

        if (y_mid * y_upper <= 0.0) {
          x_lower = x_mid;
          y_lower = y_mid;
        } else {
          x_upper = x_mid;
          y_upper = y_mid;
        }

        if (std::fabs(y_mid) <= convergence_threshold_) {
          break;
        }
      }

      const double x_interpolated((y_lower * x_upper - y_upper * x_lower) /
                                  (y_lower - y_upper));
      w[++order] = std::acos(x_interpolated) / sptk::kTwoPi;
      if (num_order_ == order) return true;

      // Update variables.
      c = (c == &buffer->c1_) ? &buffer->c2_ : &buffer->c1_;
      x = x_interpolated;
      y = CalculateChebyshevPolynomial(*c, x);
    }

    x_prev = x;
    y_prev = y;
  }

  return false;
}